

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
helics::ValueFederateManager::queryUpdates(ValueFederateManager *this)

{
  undefined1 uVar1;
  Input *pIVar2;
  vector<int,_std::allocator<int>_> *in_RDI;
  Input *inp;
  const_iterator __end1;
  const_iterator __begin1;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *__range1;
  int ii;
  shared_handle inpHandle;
  vector<int,_std::allocator<int>_> *updates;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  vector<int,_std::allocator<int>_> *this_00;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_stack_ffffffffffffff98;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_60;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *local_48;
  int local_40;
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_30;
  byte local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2a32ae);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(in_stack_ffffffffffffff98);
  local_40 = 0;
  local_48 = gmlc::libguarded::
             shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
             ::operator*(&local_30);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::begin
            ((DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
              *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::end
            ((DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
              *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  while( true ) {
    uVar1 = gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
            operator!=(&local_60,
                       (BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *)
                       &stack0xffffffffffffff88);
    if (!(bool)uVar1) break;
    pIVar2 = gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>
             ::operator*(&local_60);
    if ((pIVar2->hasUpdate & 1U) != 0) {
      std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict2 *)in_RDI);
    }
    local_40 = local_40 + 1;
    gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
    operator++((BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff60));
  }
  local_11 = 1;
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              *)0x2a33ac);
  if ((local_11 & 1) == 0) {
    CLI::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)this_00);
  }
  return this_00;
}

Assistant:

std::vector<int> ValueFederateManager::queryUpdates()
{
    std::vector<int> updates;
    auto inpHandle = inputs.lock_shared();
    int ii = 0;
    for (const auto& inp : *inpHandle) {
        if (inp.hasUpdate) {
            updates.push_back(ii);
        }
        ++ii;
    }
    return updates;
}